

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void issue429(void)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  roaring_bitmap_t *r_01;
  roaring_bitmap_t *bitmaps [2];
  roaring_bitmap_t *local_28;
  roaring_bitmap_t *local_20;
  
  r = roaring_bitmap_create_with_capacity(0);
  roaring_bitmap_add_range_closed(r,0,99);
  roaring_bitmap_remove_range_closed(r,0,0x62);
  r_00 = roaring_bitmap_copy(r);
  local_28 = r;
  local_20 = r_00;
  r_01 = roaring_bitmap_or_many_heap(2,&local_28);
  roaring_bitmap_free(r_01);
  roaring_bitmap_free(r_00);
  roaring_bitmap_free(r);
  return;
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}